

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
::resize(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
         *this,size_t new_capacity)

{
  size_t hash;
  ctrl_t *p;
  size_t capacity;
  slot_type *psVar1;
  undefined1 auVar2 [16];
  unsigned_long uVar3;
  slot_type *psVar4;
  size_t sVar5;
  FindInfo FVar6;
  Layout LVar7;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    psVar4 = this->slots_;
    capacity = this->capacity_;
    this->capacity_ = new_capacity;
    initialize_slots(this);
    if (capacity != 0) {
      sVar5 = 0;
      do {
        if (-1 < p[sVar5]) {
          auVar2 = ZEXT416((psVar4->value).first) * ZEXT816(0xde5fb9d2630458e9);
          hash = auVar2._8_8_ + auVar2._0_8_;
          FVar6 = find_first_non_full(this,hash);
          set_ctrl(this,FVar6.offset,(byte)hash & 0x7f);
          psVar1 = this->slots_;
          uVar3 = (psVar4->value).second;
          *(undefined8 *)(psVar1 + FVar6.offset) = *(undefined8 *)psVar4;
          psVar1[FVar6.offset].value.second = uVar3;
        }
        sVar5 = sVar5 + 1;
        psVar4 = psVar4 + 1;
      } while (capacity != sVar5);
      LVar7 = MakeLayout(capacity);
      Deallocate<8ul,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>
                ((allocator<std::pair<const_unsigned_int,_unsigned_long>_> *)&this->settings_,p,
                 LVar7.
                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::container_internal::map_slot_type<unsigned_int,_unsigned_long>_>
                 .size_[1] * 0x10 +
                 (LVar7.
                  super_LayoutType<sizeof___(Ts),_signed_char,_phmap::container_internal::map_slot_type<unsigned_int,_unsigned_long>_>
                  .size_[0] + 7 & 0xfffffffffffffff8));
      return;
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x72d,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned int, unsigned long>, phmap::Hash<uint32_t>, phmap::EqualTo<unsigned int>, std::allocator<std::pair<const unsigned int, unsigned long>>>::resize(size_t) [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned int, unsigned long>, Hash = phmap::Hash<uint32_t>, Eq = phmap::EqualTo<unsigned int>, Alloc = std::allocator<std::pair<const unsigned int, unsigned long>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }